

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void spvtools::anon_unknown_0::Nest
               (ControlFlowGraph *cfg,
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *id_to_index,uint32_t id,uint32_t level)

{
  mapped_type *pmVar1;
  reference pvVar2;
  SingleBlock *block;
  uint32_t block_index;
  uint32_t level_local;
  uint32_t id_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *id_to_index_local;
  ControlFlowGraph *cfg_local;
  
  if (id != 0) {
    block_index = id;
    _level_local = id_to_index;
    id_to_index_local =
         (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)cfg;
    pmVar1 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::at(id_to_index,&block_index);
    pvVar2 = std::
             vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ::operator[]((vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                           *)id_to_index_local,(ulong)*pmVar1);
    if ((pvVar2->nest_level_assigned & 1U) == 0) {
      pvVar2->nest_level = level;
      pvVar2->nest_level_assigned = true;
    }
  }
  return;
}

Assistant:

void Nest(ControlFlowGraph& cfg,
          const std::unordered_map<uint32_t, uint32_t>& id_to_index,
          uint32_t id, uint32_t level) {
  if (id == 0) {
    return;
  }

  const uint32_t block_index = id_to_index.at(id);
  SingleBlock& block = cfg.blocks[block_index];

  if (!block.nest_level_assigned) {
    block.nest_level = level;
    block.nest_level_assigned = true;
  }
}